

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cc
# Opt level: O3

string * __thiscall
ipx::Format_abi_cxx11_
          (string *__return_storage_ptr__,ipx *this,double d,int width,int prec,fmtflags floatfield)

{
  ostringstream s;
  long local_1a0;
  long local_198 [2];
  uint auStack_188 [22];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  *(long *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = (long)width;
  *(long *)((long)local_198 + *(long *)(local_1a0 + -0x18) + 8) = (long)(int)this;
  *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) =
       prec & 0x104U | *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) & 0xfffffefb;
  std::ostream::_M_insert<double>(d);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string Format(double d, int width, int prec,
                   std::ios_base::fmtflags floatfield) {
    std::ostringstream s;
    s.precision(prec);
    s.width(width);
    s.setf(floatfield, std::ios_base::floatfield);
    s << d;
    return s.str();
}